

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

lua_State * luaL_newstate(void)

{
  void *pvVar1;
  void *ud;
  lua_State *L;
  lua_State *local_8;
  
  pvVar1 = lj_alloc_create();
  if (pvVar1 == (void *)0x0) {
    local_8 = (lua_State *)0x0;
  }
  else {
    local_8 = lj_state_newstate((lua_Alloc)L,ud);
    if (local_8 != (lua_State *)0x0) {
      *(code **)((ulong)(local_8->glref).ptr32 + 0xe0) = panic;
    }
  }
  return local_8;
}

Assistant:

LUALIB_API lua_State *luaL_newstate(void)
{
  lua_State *L;
  void *ud = lj_alloc_create();
  if (ud == NULL) return NULL;
#if LJ_64
  L = lj_state_newstate(lj_alloc_f, ud);
#else
  L = lua_newstate(lj_alloc_f, ud);
#endif
  if (L) G(L)->panic = panic;
  return L;
}